

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O3

void visit_enum_decl(gvisitor_t *self,gnode_enum_decl_t *node)

{
  long *plVar1;
  _Bool _Var2;
  symboltable_t *table;
  gnode_t *node_00;
  
  plVar1 = *self->data;
  if ((plVar1 == (long *)0x0) || (*plVar1 == 0)) {
    node_00 = (gnode_t *)0x0;
  }
  else {
    node_00 = *(gnode_t **)(plVar1[2] + -8 + *plVar1 * 8);
  }
  check_access_storage_specifiers(self,&node->base,node_00->tag,node->access,node->storage);
  if (node_00->tag == NODE_FUNCTION_DECL) {
    table = symtable_from_node(node_00);
    _Var2 = symboltable_insert(table,node->identifier,&node->base);
    if (!_Var2) {
      report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Identifier %s redeclared.",
                   node->identifier);
      return;
    }
  }
  return;
}

Assistant:

static void visit_enum_decl (gvisitor_t *self, gnode_enum_decl_t *node) {
    DEBUG_SEMA2("visit_enum_decl %s", node->identifier);

    // check if optional access and storage specifiers make sense in current context
    gnode_t *top = TOP_DECLARATION();
    check_access_storage_specifiers(self, (gnode_t *)node, NODE_TAG(top), node->access, node->storage);
    
    if (NODE_ISA_FUNCTION(top)) {
        // it is a local defined enum
        symboltable_t *symtable = symtable_from_node(top);
        if (!symboltable_insert(symtable, node->identifier, (void *)node)) {
            REPORT_ERROR(node, "Identifier %s redeclared.", node->identifier);
        }
    }
}